

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

void * __thiscall
lossless_neural_sound::expression_compiler::Arena::
allocate<lossless_neural_sound::expression_compiler::Arena::Node<lossless_neural_sound::expression_compiler::expression::Sum>>
          (Arena *this)

{
  ulong uVar1;
  ulong uVar2;
  uchar *puVar3;
  _Elt_pointer pMVar4;
  _Elt_pointer pMVar5;
  
  pMVar5 = (this->memory_blocks).
           super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pMVar5 != (this->memory_blocks).
                super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pMVar4 = pMVar5;
    if (pMVar5 == (this->memory_blocks).
                  super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pMVar4 = (this->memory_blocks).
               super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    uVar2 = pMVar4[-1].used + 7 & 0xfffffffffffffff8;
    uVar1 = uVar2 + 0x50;
    if (uVar1 < 0x1001) {
      puVar3 = pMVar4->bytes + uVar2;
      pMVar4[-1].used = uVar1;
      goto LAB_0011bb03;
    }
  }
  if (pMVar5 == (this->memory_blocks).
                super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
    ::_M_push_back_aux<>(&this->memory_blocks);
    pMVar5 = (this->memory_blocks).
             super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  }
  else {
    memset(pMVar5,0,0x1010);
    pMVar5 = (this->memory_blocks).
             super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    (this->memory_blocks).
    super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pMVar5;
  }
  if (pMVar5 == (this->memory_blocks).
                super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pMVar5 = (this->memory_blocks).
             super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 1;
  }
  uVar2 = pMVar5[-1].used + 7 & 0xfffffffffffffff8;
  uVar1 = uVar2 + 0x50;
  if (0x1000 < uVar1) {
    __assert_fail("retval",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/arena.h"
                  ,0x6f,
                  "void *lossless_neural_sound::expression_compiler::Arena::allocate() [T = lossless_neural_sound::expression_compiler::Arena::Node<lossless_neural_sound::expression_compiler::expression::Sum>]"
                 );
  }
  puVar3 = pMVar5->bytes + uVar2;
  pMVar5[-1].used = uVar1;
LAB_0011bb03:
  return puVar3 + -0x1010;
}

Assistant:

void *allocate()
    {
        static_assert(alignof(T) <= memory_block_alignment, "");
        static_assert(is_nonzero_power_of_2(alignof(T)), "");
        assert(sizeof(T) < big_memory_block_start_size);
        void *retval = memory_blocks.empty() ?
                           nullptr :
                           memory_blocks.back().allocate<sizeof(T), alignof(T)>();
        if(!retval)
        {
            memory_blocks.emplace_back();
            retval = memory_blocks.back().allocate<sizeof(T), alignof(T)>();
        }
        assert(retval);
        return retval;
    }